

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RuleParser.cpp
# Opt level: O0

void __thiscall Refal2::CRuleParser::EndFunction(CRuleParser *this)

{
  bool bVar1;
  byte bVar2;
  CToken local_58;
  CRulePtr local_18;
  CRulePtr firstRule;
  CRuleParser *this_local;
  
  firstRule._M_t.super___uniq_ptr_impl<Refal2::CRule,_std::default_delete<Refal2::CRule>_>._M_t.
  super__Tuple_impl<0UL,_Refal2::CRule_*,_std::default_delete<Refal2::CRule>_>.
  super__Head_base<0UL,_Refal2::CRule_*,_false>._M_head_impl =
       (__uniq_ptr_data<Refal2::CRule,_std::default_delete<Refal2::CRule>,_true,_true>)
       (__uniq_ptr_data<Refal2::CRule,_std::default_delete<Refal2::CRule>,_true,_true>)this;
  bVar1 = CToken::IsNone(&this->functionName);
  if (!bVar1) {
    bVar2 = std::__cxx11::string::empty();
    if (((bVar2 ^ 0xff) & 1) == 0) {
      __assert_fail("!functionName.word.empty()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/cmc-msu-ai[P]refal/src/RuleParser.cpp"
                    ,0x25,"void Refal2::CRuleParser::EndFunction()");
    }
    std::unique_ptr<Refal2::CRule,std::default_delete<Refal2::CRule>>::
    unique_ptr<std::default_delete<Refal2::CRule>,void>
              ((unique_ptr<Refal2::CRule,std::default_delete<Refal2::CRule>> *)&local_18);
    CFunctionBuilder::Export((CFunctionBuilder *)this,&local_18);
    bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&local_18);
    if (bVar1) {
      CModuleBuilder::SetOrdinary((CModuleBuilder *)this,&this->functionName,&local_18);
    }
    else {
      CModuleBuilder::SetEmpty((CModuleBuilder *)this,&this->functionName);
    }
    CToken::CToken(&local_58);
    CToken::operator=(&this->functionName,&local_58);
    CToken::~CToken(&local_58);
    std::unique_ptr<Refal2::CRule,_std::default_delete<Refal2::CRule>_>::~unique_ptr(&local_18);
  }
  return;
}

Assistant:

void CRuleParser::EndFunction()
{
	if( !functionName.IsNone() ) {
		assert( !functionName.word.empty() );
		CRulePtr firstRule;
		CFunctionBuilder::Export( firstRule );
		if( static_cast<bool>( firstRule ) ) {
			CModuleBuilder::SetOrdinary( functionName, firstRule );
		} else {
			CModuleBuilder::SetEmpty( functionName );
		}
		functionName = CToken();
	}
}